

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O0

void __thiscall ncnn::Reshape::Reshape(Reshape *this)

{
  Layer *in_RDI;
  
  Layer::Layer(in_RDI);
  in_RDI->_vptr_Layer = (_func_int **)&PTR__Reshape_02014318;
  std::__cxx11::string::string((string *)&in_RDI[1].support_reserved_6);
  in_RDI->one_blob_only = true;
  in_RDI->support_inplace = false;
  return;
}

Assistant:

Reshape::Reshape()
{
    one_blob_only = true;
    support_inplace = false;
}